

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O0

string * __thiscall
Json::JsonParser::parseString_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  JsonException *pJVar4;
  char *pcVar5;
  allocator<char> local_72;
  char local_71;
  undefined1 local_70 [7];
  char c;
  string unicodeS;
  undefined1 local_40 [8];
  string hex_oct;
  char sn;
  char s;
  char prev_local;
  JsonParser *this_local;
  
  hex_oct.field_2._M_local_buf[0xf] = prev;
  buffer_reset(this);
  buffer_append(this,hex_oct.field_2._M_local_buf[0xf]);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (hex_oct.field_2._M_local_buf[0xe] = JsonReader::get(&this->__reader),
                hex_oct.field_2._M_local_buf[0xe] != '\\') {
            if (hex_oct.field_2._M_local_buf[0xe] == '\"') {
              buffer_append(this,'\"');
              while ((local_71 = JsonReader::peek(&this->__reader), local_71 != ',' &&
                     (bVar2 = is_normal_char(local_71), !bVar2))) {
                cVar1 = JsonReader::get(&this->__reader);
                bVar2 = is_space_char(cVar1);
                if (!bVar2) {
                  pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
                  JsonException::JsonException(pJVar4,&this->__reader);
                  __cxa_throw(pJVar4,&JsonException::typeinfo,JsonException::~JsonException);
                }
              }
              pcVar5 = buffer_str(this);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,pcVar5,&local_72);
              std::allocator<char>::~allocator(&local_72);
              return __return_storage_ptr__;
            }
            buffer_append(this,hex_oct.field_2._M_local_buf[0xe]);
          }
          if ((this->__escape & 1U) != 0) break;
          buffer_append(this,'\\');
          cVar1 = JsonReader::get(&this->__reader);
          buffer_append(this,cVar1);
        }
        hex_oct.field_2._M_local_buf[0xd] = JsonReader::get(&this->__reader);
        bVar2 = is_escape(hex_oct.field_2._M_local_buf[0xd]);
        if (!bVar2) break;
        cVar1 = convert2escape(this,hex_oct.field_2._M_local_buf[0xd]);
        buffer_append(this,cVar1);
      }
      if ((hex_oct.field_2._M_local_buf[0xd] != 'x') &&
         (bVar2 = is_number(hex_oct.field_2._M_local_buf[0xd]), !bVar2)) break;
      resolve_escape_number_abi_cxx11_((string *)local_40,this,hex_oct.field_2._M_local_buf[0xd]);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(pJVar4,&this->__reader);
        __cxa_throw(pJVar4,&JsonException::typeinfo,JsonException::~JsonException);
      }
      pcVar5 = (char *)std::__cxx11::string::c_str();
      buffer_append(this,pcVar5);
      std::__cxx11::string::~string((string *)local_40);
    }
    if (hex_oct.field_2._M_local_buf[0xd] != 'u') break;
    resolve_escape_hex_unicode_abi_cxx11_((string *)local_70,this);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(pJVar4,&this->__reader);
      __cxa_throw(pJVar4,&JsonException::typeinfo,JsonException::~JsonException);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    buffer_append(this,pcVar5);
    std::__cxx11::string::~string((string *)local_70);
  }
  pJVar4 = (JsonException *)__cxa_allocate_exception(0x50);
  JsonException::JsonException(pJVar4,&this->__reader);
  __cxa_throw(pJVar4,&JsonException::typeinfo,JsonException::~JsonException);
}

Assistant:

std::string Json::JsonParser::parseString(char prev) {
    buffer_reset();
    buffer_append(prev);
    for (;;) {
        char s = __reader.get();
        if (s == '\\') {
            if (!__escape) {
                buffer_append('\\');
                buffer_append(__reader.get());
                continue;
            }
            char sn = __reader.get();
            if (is_escape(sn)) {
                buffer_append(convert2escape(sn));
                // parse hex string
            } else if (sn == 'x' || is_number(sn)) {
                std::string hex_oct = resolve_escape_number(sn);
                if (hex_oct.empty()) throw JsonException(__reader);
                buffer_append(hex_oct.c_str());
                // parse unicode string
            } else if (sn == 'u') {
                std::string unicodeS = resolve_escape_hex_unicode();
                if (unicodeS.empty()) throw JsonException(__reader);
                buffer_append(unicodeS.c_str());
            } else throw JsonException(__reader);
        } else if (s == '\"') {
            buffer_append('\"');
            for (;;) {
                char c = __reader.peek();
                if (c == JSON_SEPARATE || JsonParser::is_normal_char(c)) {
                    break;
                } else if (is_space_char(__reader.get()))continue;
                else throw JsonException(__reader);
            }
            break;
        } else buffer_append(s);
    }
    return buffer_str();
}